

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O3

void __thiscall
Assimp::Discreet3DSImporter::ApplyMasterScale(Discreet3DSImporter *this,aiScene *pScene)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  aiNode *paVar12;
  float fVar13;
  uint uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  uVar14 = -(uint)(this->mMasterScale != 0.0);
  fVar13 = (float)(~uVar14 & 0x3f800000 | (uint)(1.0 / this->mMasterScale) & uVar14);
  this->mMasterScale = fVar13;
  paVar12 = pScene->mRootNode;
  fVar15 = (paVar12->mTransformation).a1;
  fVar16 = (paVar12->mTransformation).a3;
  fVar19 = (paVar12->mTransformation).a4;
  fVar22 = (paVar12->mTransformation).b1;
  fVar1 = (paVar12->mTransformation).b3;
  fVar2 = (paVar12->mTransformation).b4;
  fVar3 = (paVar12->mTransformation).c1;
  fVar4 = (paVar12->mTransformation).c3;
  fVar5 = (paVar12->mTransformation).c4;
  fVar6 = (paVar12->mTransformation).d1;
  fVar20 = (paVar12->mTransformation).a2;
  fVar21 = fVar20 * 0.0;
  fVar23 = fVar15 * 0.0 + fVar21;
  fVar17 = fVar16 * 0.0;
  fVar7 = (paVar12->mTransformation).d3;
  fVar18 = fVar19 * 0.0;
  fVar8 = (paVar12->mTransformation).d4;
  fVar9 = (paVar12->mTransformation).b2;
  fVar10 = (paVar12->mTransformation).c2;
  fVar11 = (paVar12->mTransformation).d2;
  (paVar12->mTransformation).a1 = fVar18 + fVar17 + fVar15 * fVar13 + fVar21;
  (paVar12->mTransformation).a2 = fVar18 + fVar17 + fVar15 * 0.0 + fVar20 * fVar13;
  (paVar12->mTransformation).a3 = fVar13 * fVar16 + fVar23 + fVar18;
  (paVar12->mTransformation).a4 = fVar23 + fVar17 + fVar19;
  fVar15 = fVar9 * 0.0;
  fVar19 = fVar22 * 0.0 + fVar15;
  fVar20 = fVar1 * 0.0;
  fVar16 = fVar2 * 0.0;
  (paVar12->mTransformation).b1 = fVar16 + fVar20 + fVar22 * fVar13 + fVar15;
  (paVar12->mTransformation).b2 = fVar16 + fVar20 + fVar22 * 0.0 + fVar9 * fVar13;
  (paVar12->mTransformation).b3 = fVar13 * fVar1 + fVar19 + fVar16;
  (paVar12->mTransformation).b4 = fVar19 + fVar20 + fVar2;
  fVar22 = fVar10 * 0.0;
  fVar16 = fVar3 * 0.0 + fVar22;
  fVar19 = fVar4 * 0.0;
  fVar15 = fVar5 * 0.0;
  (paVar12->mTransformation).c1 = fVar15 + fVar19 + fVar3 * fVar13 + fVar22;
  (paVar12->mTransformation).c2 = fVar15 + fVar19 + fVar3 * 0.0 + fVar10 * fVar13;
  (paVar12->mTransformation).c3 = fVar13 * fVar4 + fVar16 + fVar15;
  (paVar12->mTransformation).c4 = fVar16 + fVar19 + fVar5;
  fVar22 = fVar11 * 0.0;
  fVar16 = fVar6 * 0.0 + fVar22;
  fVar19 = fVar7 * 0.0;
  fVar15 = fVar8 * 0.0;
  (paVar12->mTransformation).d1 = fVar15 + fVar19 + fVar6 * fVar13 + fVar22;
  (paVar12->mTransformation).d2 = fVar15 + fVar19 + fVar6 * 0.0 + fVar11 * fVar13;
  (paVar12->mTransformation).d3 = fVar13 * fVar7 + fVar16 + fVar15;
  (paVar12->mTransformation).d4 = fVar16 + fVar19 + fVar8;
  return;
}

Assistant:

void Discreet3DSImporter::ApplyMasterScale(aiScene* pScene)
{
    // There are some 3DS files with a zero scaling factor
    if (!mMasterScale)mMasterScale = 1.0f;
    else mMasterScale = 1.0f / mMasterScale;

    // Construct an uniform scaling matrix and multiply with it
    pScene->mRootNode->mTransformation *= aiMatrix4x4(
        mMasterScale,0.0f, 0.0f, 0.0f,
        0.0f, mMasterScale,0.0f, 0.0f,
        0.0f, 0.0f, mMasterScale,0.0f,
        0.0f, 0.0f, 0.0f, 1.0f);

    // Check whether a scaling track is assigned to the root node.
}